

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_test.cc
# Opt level: O3

void intgemm::kernel_write_test<(intgemm::CPUType)1,float>(void)

{
  long lVar1;
  bool bVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  float fVar6;
  AlignedVector<float> output;
  AlignedVector<float> input;
  AssertionHandler catchAssertionHandler;
  float local_ec;
  AlignedVector<float> local_e8;
  AlignedVector<float> local_d8;
  SourceLineInfo local_c8;
  ITransientExpression local_b8;
  long local_a8;
  char *local_a0;
  size_t sStack_98;
  float *local_90;
  StringRef local_88;
  AssertionHandler local_78;
  
  if (0 < kCPU) {
    AlignedVector<float>::AlignedVector(&local_d8,4,0x40);
    AlignedVector<float>::AlignedVector(&local_e8,4,0x40);
    if (local_d8.size_ != 0) {
      fVar6 = 0.0;
      lVar4 = 0;
      do {
        *(float *)((long)local_d8.mem_ + lVar4) = fVar6;
        fVar6 = fVar6 + 1.0;
        lVar4 = lVar4 + 4;
      } while (local_d8.size_ << 2 != lVar4);
    }
    uVar3 = *(undefined8 *)(local_d8.mem_ + 2);
    *(undefined8 *)local_e8.mem_ = *(undefined8 *)local_d8.mem_;
    *(undefined8 *)(local_e8.mem_ + 2) = uVar3;
    lVar4 = 0;
    lVar5 = 0;
    do {
      local_b8._vptr_ITransientExpression = (_func_int **)0x1b2b11;
      local_b8.m_isBinaryExpression = true;
      local_b8.m_result = false;
      local_b8._10_6_ = 0;
      local_c8.file =
           "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/write_test.cc"
      ;
      local_c8.line = 0x1c;
      Catch::StringRef::StringRef(&local_88,"output[i] == ElemType_(i)");
      Catch::AssertionHandler::AssertionHandler
                (&local_78,(StringRef *)&local_b8,&local_c8,local_88,ContinueOnFailure);
      local_ec = (float)lVar5;
      bVar2 = local_ec == *(float *)((long)local_e8.mem_ + lVar4);
      lVar1 = (long)local_e8.mem_ + lVar4;
      Catch::StringRef::StringRef((StringRef *)&local_c8,"==");
      local_b8.m_result = bVar2;
      local_b8.m_isBinaryExpression = true;
      local_b8._vptr_ITransientExpression =
           (_func_int **)&PTR_streamReconstructedExpression_001eb7d8;
      local_a0 = local_c8.file;
      sStack_98 = local_c8.line;
      local_90 = &local_ec;
      local_a8 = lVar1;
      Catch::AssertionHandler::handleExpr(&local_78,&local_b8);
      Catch::ITransientExpression::~ITransientExpression(&local_b8);
      Catch::AssertionHandler::complete(&local_78);
      if (local_78.m_completed == false) {
        (*(local_78.m_resultCapture)->_vptr_IResultCapture[0xe])(local_78.m_resultCapture,&local_78)
        ;
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 4;
    } while (lVar5 != 4);
    free(local_e8.mem_);
    free(local_d8.mem_);
  }
  return;
}

Assistant:

void kernel_write_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, ElemType_>;
  constexpr static std::size_t VECTOR_LENGTH = sizeof(vec_t) / sizeof(ElemType_);

  AlignedVector<ElemType_> input(VECTOR_LENGTH);
  AlignedVector<ElemType_> output(VECTOR_LENGTH);

  std::iota(input.begin(), input.end(), static_cast<ElemType_>(0));

  kernels::write(*input.template as<vec_t>(), output.begin(), 0);
  for (std::size_t i = 0; i < VECTOR_LENGTH; ++i)
#if !defined( __EXCEPTIONS) && defined(__GNUC__) && (__GNUC__ == 9) && ((__GNUC_MINOR__ == 3) || (__GNUC_MINOR__ == 4))
    CHECK(output[i] == input[i]); // GCC 9.3 - exceptions breaks std::iota with newer check.
#else
    CHECK(output[i] == ElemType_(i));
#endif
}